

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
          (QMovableArrayOps<ProString> *this,qsizetype i,ProString *args)

{
  ProString **ppPVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  ProString tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size == i) {
      qVar5 = QArrayDataPointer<ProString>::freeSpaceAtEnd((QArrayDataPointer<ProString> *)this);
      if (qVar5 == 0) goto LAB_0012f2fb;
      ProString::ProString
                ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr +
                 (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size,
                 args);
LAB_0012f3e7:
      pqVar2 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0012f3a6;
    }
LAB_0012f2fb:
    if (i == 0) {
      qVar5 = QArrayDataPointer<ProString>::freeSpaceAtBegin((QArrayDataPointer<ProString> *)this);
      if (qVar5 != 0) {
        ProString::ProString
                  ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr
                   + -1,args);
        ppPVar1 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
        *ppPVar1 = *ppPVar1 + -1;
        goto LAB_0012f3e7;
      }
    }
  }
  tmp.m_file = -0x55555556;
  tmp._36_4_ = 0xaaaaaaaa;
  tmp.m_hash = 0xaaaaaaaaaaaaaaaa;
  tmp.m_string.d.size = -0x5555555555555556;
  tmp.m_offset = -0x55555556;
  tmp.m_length = -0x55555556;
  tmp.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size != 0;
  QArrayDataPointer<ProString>::detachAndGrow
            ((QArrayDataPointer<ProString> *)this,(uint)(i == 0 && bVar6),1,(ProString **)0x0,
             (QArrayDataPointer<ProString> *)0x0);
  if (i == 0 && bVar6) {
    ProString::ProString
              ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr + -1
               ,&tmp);
    ppPVar1 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
    *ppPVar1 = *ppPVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<ProString> *)this,i,1);
    ProString::ProString(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    Inserter::~Inserter(&local_80);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tmp);
LAB_0012f3a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }